

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadStringFallback
          (EpsCopyInputStream *this,char *ptr,int size,string *str)

{
  LogMessage *other;
  char *pcVar1;
  int s;
  int s_00;
  LogFinisher local_71;
  anon_class_8_1_ba1d7991 local_70;
  LogMessage local_68;
  
  str->_M_string_length = 0;
  *(str->_M_dataplus)._M_p = '\0';
  pcVar1 = this->buffer_end_;
  if ((long)size <= (long)(pcVar1 + ((long)this->limit_ - (long)ptr))) {
    std::__cxx11::string::reserve((ulong)str);
    pcVar1 = this->buffer_end_;
  }
  s_00 = ((int)pcVar1 - (int)ptr) + 0x10;
  local_70.str = str;
  while( true ) {
    s = size - s_00;
    if (s == 0 || size < s_00) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.h"
                 ,0x146);
      other = LogMessage::operator<<(&local_68,"CHECK failed: size > chunk_size: ");
      LogFinisher::operator=(&local_71,other);
      LogMessage::~LogMessage(&local_68);
    }
    if (((this->next_chunk_ == (char *)0x0) ||
        (ReadStringFallback::anon_class_8_1_ba1d7991::operator()(&local_70,ptr,s_00),
        this->limit_ < 0x11)) || (pcVar1 = Next(this), pcVar1 == (char *)0x0)) break;
    ptr = pcVar1 + 0x10;
    s_00 = (*(int *)&this->buffer_end_ - (int)ptr) + 0x10;
    size = s;
    if (s <= s_00) {
      ReadStringFallback::anon_class_8_1_ba1d7991::operator()(&local_70,ptr,s);
      return ptr + s;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::ReadStringFallback(const char* ptr, int size,
                                                   std::string* str) {
  str->clear();
  if (PROTOBUF_PREDICT_TRUE(size <= buffer_end_ - ptr + limit_)) {
    // Reserve the string up to a static safe size. If strings are bigger than
    // this we proceed by growing the string as needed. This protects against
    // malicious payloads making protobuf hold on to a lot of memory.
    str->reserve(str->size() + std::min<int>(size, kSafeStringSize));
  }
  return AppendSize(ptr, size,
                    [str](const char* p, int s) { str->append(p, s); });
}